

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StockPileColliderTests.cpp
# Opt level: O0

void __thiscall
solitaire::colliders::StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test
::TestBody(StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test *this)

{
  bool bVar1;
  MockSpec<std::optional<unsigned_int>_()> *this_00;
  TypedExpectation<std::optional<unsigned_int>_()> *this_01;
  char *message;
  StockPileMock *in_RSI;
  AssertHelper local_a0;
  Message local_98;
  Position local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  ReturnAction<std::optional<unsigned_int>_> local_60;
  Action<std::optional<unsigned_int>_()> local_50;
  WithoutMatchers local_29;
  MockSpec<std::optional<unsigned_int>_()> local_28;
  ParamType *local_18;
  ParamType *uncoveredCardsPositionData;
  StockPileColliderGetUncoveredCardsPositionTests_getUncoveredCardsPosition_Test *this_local;
  
  uncoveredCardsPositionData = (ParamType *)this;
  local_18 = testing::WithParamInterface<solitaire::colliders::UncoveredPileCardsPositionData>::
             GetParam();
  local_28.function_mocker_ =
       (FunctionMocker<std::optional<unsigned_int>_()> *)
       piles::StockPileMock::gmock_getSelectedCardIndex
                 ((MockSpec<std::optional<unsigned_int>_()> *)
                  &(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                   super_StockPileColliderTests.stockPileMock,in_RSI);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::optional<unsigned_int>_()>::operator()
                      (&local_28,&local_29,(void *)0x0);
  this_01 = testing::internal::MockSpec<std::optional<unsigned_int>_()>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/colliders/StockPileColliderTests.cpp"
                       ,0x75,"stockPileMock","getSelectedCardIndex()");
  testing::Return<std::optional<unsigned_int>>
            ((testing *)&local_60,
             (optional<unsigned_int>)
             (local_18->selectedCardIndex).super__Optional_base<unsigned_int,_true,_true>._M_payload
             .super__Optional_payload_base<unsigned_int>);
  testing::internal::ReturnAction::operator_cast_to_Action(&local_50,(ReturnAction *)&local_60);
  testing::internal::TypedExpectation<std::optional<unsigned_int>_()>::WillOnce(this_01,&local_50);
  testing::Action<std::optional<unsigned_int>_()>::~Action(&local_50);
  testing::internal::ReturnAction<std::optional<unsigned_int>_>::~ReturnAction(&local_60);
  local_90 = StockPileCollider::getUncoveredCardsPosition
                       (&(this->super_StockPileColliderGetUncoveredCardsPositionTests).
                         super_StockPileColliderTests.collider);
  testing::internal::EqHelper::
  Compare<solitaire::geometry::Position,_solitaire::geometry::Position,_nullptr>
            ((EqHelper *)local_88,"collider.getUncoveredCardsPosition()",
             "uncoveredCardsPositionData.position",&local_90,&local_18->position);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/colliders/StockPileColliderTests.cpp"
               ,0x7b,message);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  return;
}

Assistant:

TEST_P(StockPileColliderGetUncoveredCardsPositionTests, getUncoveredCardsPosition) {
    const auto& uncoveredCardsPositionData = GetParam();
    EXPECT_CALL(stockPileMock, getSelectedCardIndex())
        .WillOnce(Return(uncoveredCardsPositionData.selectedCardIndex));

    EXPECT_EQ(
        collider.getUncoveredCardsPosition(),
        uncoveredCardsPositionData.position
    );
}